

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TryHoistInvariant
          (GlobOpt *this,Instr *instr,BasicBlock *block,Value *dstVal,Value *src1Val,Value *src2Val,
          bool isNotTypeSpecConv,bool lossy,bool forceInvariantHoisting,BailOutKind bailoutKind)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  BVIndex BVar3;
  char16 *pcVar4;
  PageAllocator *pageAllocator;
  JitArenaAllocator *alloc;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  undefined4 *puVar5;
  bool local_155;
  TrackAllocData local_118;
  BVSparse<Memory::JitArenaAllocator> *local_f0;
  BVSparse<Memory::JitArenaAllocator> *tempByteCodeUse;
  NoRecoverMemoryJitArenaAllocator tempAllocator;
  PropertySym *propertySymUse;
  Loop *loop;
  bool forceInvariantHoisting_local;
  bool lossy_local;
  bool isNotTypeSpecConv_local;
  Value *src2Val_local;
  Value *src1Val_local;
  Value *dstVal_local;
  BasicBlock *block_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  bVar2 = IsLoopPrePass(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3cc6,"(!this->IsLoopPrePass())","!this->IsLoopPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = OptIsInvariant(this,instr,block,block->loop,src1Val,src2Val,isNotTypeSpecConv,
                         forceInvariantHoisting);
  if (bVar2) {
    sourceContextId = Func::GetSourceContextId(this->func);
    functionId = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01ec1678,InvariantsPhase,sourceContextId,functionId);
    if (bVar2) {
      Output::Print(L" **** INVARIANT  ***   ");
      IR::Instr::Dump(instr);
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InvariantsPhase);
    if (bVar2) {
      Output::Print(L" **** INVARIANT  ***   ");
      pcVar4 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
      Output::Print(L"%s \n",pcVar4);
    }
    propertySymUse = (PropertySym *)block->loop;
    while( true ) {
      local_155 = false;
      if (propertySymUse->m_func != (Func *)0x0) {
        local_155 = OptIsInvariant(this,instr,block,(Loop *)propertySymUse->m_func,src1Val,src2Val,
                                   isNotTypeSpecConv,forceInvariantHoisting);
      }
      if (local_155 == false) break;
      propertySymUse = (PropertySym *)propertySymUse->m_func;
    }
    if (isNotTypeSpecConv) {
      InsertNoImplicitCallUses(this,instr);
      CaptureByteCodeSymUses(this,instr);
      InsertByteCodeUses(this,instr,true);
    }
    else {
      tempAllocator.super_JitArenaAllocator.bvFreeList = (BVSparseNode *)0x0;
      pageAllocator =
           Memory::ArenaData::GetPageAllocator
                     (&(this->alloc->super_ArenaAllocator).
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       super_ArenaData);
      Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
                ((NoRecoverMemoryJitArenaAllocator *)&tempByteCodeUse,L"BE-GlobOpt-Temp",
                 pageAllocator,Js::Throw::OutOfMemory);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_118,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                 ,0x3cec);
      alloc = (JitArenaAllocator *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             &tempByteCodeUse,&local_118);
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,alloc,0x4e98c0);
      BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,(JitArenaAllocator *)&tempByteCodeUse);
      local_f0 = this_00;
      TrackByteCodeSymUsed
                (instr,this_00,(PropertySym **)&tempAllocator.super_JitArenaAllocator.bvFreeList);
      BVar3 = BVSparse<Memory::JitArenaAllocator>::Count(local_f0);
      if ((BVar3 != 0) || (tempAllocator.super_JitArenaAllocator.bvFreeList != (BVSparseNode *)0x0))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3cee,"(tempByteCodeUse->Count() == 0 && propertySymUse == __null)",
                           "tempByteCodeUse->Count() == 0 && propertySymUse == NULL");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      Memory::NoRecoverMemoryJitArenaAllocator::~NoRecoverMemoryJitArenaAllocator
                ((NoRecoverMemoryJitArenaAllocator *)&tempByteCodeUse);
    }
    OptHoistInvariant(this,instr,block,(Loop *)propertySymUse,dstVal,src1Val,src2Val,
                      isNotTypeSpecConv,lossy,bailoutKind);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::TryHoistInvariant(
    IR::Instr *instr,
    BasicBlock *block,
    Value *dstVal,
    Value *src1Val,
    Value *src2Val,
    bool isNotTypeSpecConv,
    const bool lossy,
    const bool forceInvariantHoisting,
    IR::BailOutKind bailoutKind)
{
    Assert(!this->IsLoopPrePass());

    if (OptIsInvariant(instr, block, block->loop, src1Val, src2Val, isNotTypeSpecConv, forceInvariantHoisting))
    {
#if DBG
        if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::InvariantsPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
        {
            Output::Print(_u(" **** INVARIANT  ***   "));
            instr->Dump();
        }
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::InvariantsPhase))
        {
            Output::Print(_u(" **** INVARIANT  ***   "));
            Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
        }
#endif
        Loop *loop = block->loop;

        // Try hoisting from to outer most loop
        while (loop->parent && OptIsInvariant(instr, block, loop->parent, src1Val, src2Val, isNotTypeSpecConv, forceInvariantHoisting))
        {
            loop = loop->parent;
        }

        // Record the byte code use here since we are going to move this instruction up
        if (isNotTypeSpecConv)
        {
            InsertNoImplicitCallUses(instr);
            this->CaptureByteCodeSymUses(instr);
            this->InsertByteCodeUses(instr, true);
        }
#if DBG
        else
        {
            PropertySym *propertySymUse = NULL;
            NoRecoverMemoryJitArenaAllocator tempAllocator(_u("BE-GlobOpt-Temp"), this->alloc->GetPageAllocator(), Js::Throw::OutOfMemory);
            BVSparse<JitArenaAllocator> * tempByteCodeUse = JitAnew(&tempAllocator, BVSparse<JitArenaAllocator>, &tempAllocator);
            GlobOpt::TrackByteCodeSymUsed(instr, tempByteCodeUse, &propertySymUse);
            Assert(tempByteCodeUse->Count() == 0 && propertySymUse == NULL);
        }
#endif
        OptHoistInvariant(instr, block, loop, dstVal, src1Val, src2Val, isNotTypeSpecConv, lossy, bailoutKind);
        return true;
    }

    return false;
}